

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eset.c
# Opt level: O3

void duckdb_je_eset_insert(eset_t *eset,edata_t *edata)

{
  atomic_zu_t *paVar1;
  ulong uVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  edata_t *peVar6;
  long lVar7;
  _Bool _Var8;
  size_t sVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  ulong size;
  
  uVar2 = (edata->field_2).e_size_esn;
  size = uVar2 & 0xfffffffffffff000;
  sVar9 = duckdb_je_sz_psz_quantize_floor(size);
  if (sVar9 < 0x7000000000000001) {
    uVar12 = sVar9 - 1;
    if (uVar12 == 0) {
      uVar11 = 0x40;
    }
    else {
      lVar7 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      uVar11 = (uint)lVar7 ^ 0x3f;
    }
    iVar13 = 0x32 - uVar11;
    if (0x32 < uVar11) {
      iVar13 = 0;
    }
    bVar10 = 0xc;
    if (0x4000 < sVar9) {
      bVar10 = (char)iVar13 + 0xb;
    }
    uVar12 = (ulong)(((uint)(uVar12 >> (bVar10 & 0x3f)) & 3) + iVar13 * 4);
  }
  else {
    uVar12 = 199;
  }
  pvVar3 = edata->e_addr;
  uVar4 = edata->e_sn;
  _Var8 = duckdb_je_edata_heap_empty(&eset->bins[uVar12].heap);
  if (_Var8) {
    eset->bitmap[uVar12 >> 6] = eset->bitmap[uVar12 >> 6] | 1L << ((byte)uVar12 & 0x3f);
    eset->bins[uVar12].heap_min.sn = uVar4;
  }
  else {
    uVar5 = eset->bins[uVar12].heap_min.sn;
    if (-1 < (int)(((uint)(uVar4 >= uVar5 && uVar4 != uVar5) - (uint)(uVar4 < uVar5)) * 2 -
                  (uint)(pvVar3 < (void *)eset->bins[uVar12].heap_min.addr))) goto LAB_00cdf0cb;
    eset->bins[uVar12].heap_min.sn = uVar4;
  }
  eset->bins[uVar12].heap_min.addr = (uintptr_t)pvVar3;
LAB_00cdf0cb:
  duckdb_je_edata_heap_insert(&eset->bins[uVar12].heap,edata);
  eset->bin_stats[uVar12].nextents.repr = eset->bin_stats[uVar12].nextents.repr + 1;
  paVar1 = &eset->bin_stats[uVar12].nbytes;
  paVar1->repr = paVar1->repr + size;
  (edata->field_6).ql_link_inactive.qre_next = edata;
  (edata->field_6).ql_link_inactive.qre_prev = edata;
  peVar6 = (eset->lru).head.qlh_first;
  if (peVar6 != (edata_t *)0x0) {
    (edata->field_6).ql_link_inactive.qre_next = (peVar6->field_6).ql_link_inactive.qre_prev;
    (((eset->lru).head.qlh_first)->field_6).ql_link_inactive.qre_prev = edata;
    (edata->field_6).ql_link_inactive.qre_prev =
         (((edata->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next;
    peVar6 = (eset->lru).head.qlh_first;
    (((peVar6->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next = peVar6;
    (((edata->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next = edata;
    edata = (edata->field_6).ql_link_inactive.qre_next;
  }
  (eset->lru).head.qlh_first = edata;
  (eset->npages).repr = (eset->npages).repr + (uVar2 >> 0xc);
  return;
}

Assistant:

void
eset_insert(eset_t *eset, edata_t *edata) {
	assert(edata_state_get(edata) == eset->state);

	size_t size = edata_size_get(edata);
	size_t psz = sz_psz_quantize_floor(size);
	pszind_t pind = sz_psz2ind(psz);

	edata_cmp_summary_t edata_cmp_summary = edata_cmp_summary_get(edata);
	if (edata_heap_empty(&eset->bins[pind].heap)) {
		fb_set(eset->bitmap, ESET_NPSIZES, (size_t)pind);
		/* Only element is automatically the min element. */
		eset->bins[pind].heap_min = edata_cmp_summary;
	} else {
		/*
		 * There's already a min element; update the summary if we're
		 * about to insert a lower one.
		 */
		if (edata_cmp_summary_comp(edata_cmp_summary,
		    eset->bins[pind].heap_min) < 0) {
			eset->bins[pind].heap_min = edata_cmp_summary;
		}
	}
	edata_heap_insert(&eset->bins[pind].heap, edata);

	if (config_stats) {
		eset_stats_add(eset, pind, size);
	}

	edata_list_inactive_append(&eset->lru, edata);
	size_t npages = size >> LG_PAGE;
	/*
	 * All modifications to npages hold the mutex (as asserted above), so we
	 * don't need an atomic fetch-add; we can get by with a load followed by
	 * a store.
	 */
	size_t cur_eset_npages =
	    atomic_load_zu(&eset->npages, ATOMIC_RELAXED);
	atomic_store_zu(&eset->npages, cur_eset_npages + npages,
	    ATOMIC_RELAXED);
}